

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O0

void __thiscall FMB::FiniteModelMultiSorted::initTables(FiniteModelMultiSorted *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  Term *pTVar5;
  undefined8 uVar6;
  DArray<int> *this_00;
  int *piVar7;
  DArray<unsigned_int> *in_RDI;
  uint i_2;
  uint s;
  int mult;
  uint i_1;
  uint add_1;
  OperatorType *sig_1;
  uint arity_1;
  uint p;
  uint i;
  uint add;
  OperatorType *sig;
  uint arity;
  uint f;
  uint offsets;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  OperatorType *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  size_t in_stack_ffffffffffffff48;
  DArray<unsigned_int> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  uint local_70;
  uint local_6c;
  uint local_58;
  int local_54;
  uint local_40;
  uint local_28;
  int local_24;
  uint local_10;
  uint local_c;
  
  Kernel::Signature::functions((Signature *)0x2d2515);
  Lib::DArray<unsigned_int>::ensure
            ((DArray<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (size_t)in_stack_ffffffffffffff50);
  Kernel::Signature::predicates((Signature *)0x2d2541);
  Lib::DArray<unsigned_int>::ensure
            ((DArray<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (size_t)in_stack_ffffffffffffff50);
  local_c = 0;
  local_10 = 0;
  while( true ) {
    uVar2 = Kernel::Signature::functions((Signature *)0x2d2580);
    if (uVar2 <= local_10) {
      Lib::DArray<unsigned_int>::expand
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      local_c = 0;
      local_40 = 1;
      while( true ) {
        uVar2 = Kernel::Signature::predicates((Signature *)0x2d276c);
        if (uVar2 <= local_40) {
          Lib::DArray<char>::expand
                    ((DArray<char> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     (char)(in_stack_ffffffffffffff44 >> 0x18));
          Kernel::Signature::typeCons((Signature *)0x2d296a);
          Lib::DArray<Lib::DArray<int>_>::ensure
                    ((DArray<Lib::DArray<int>_> *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (size_t)in_stack_ffffffffffffff50);
          local_6c = 0;
          while (uVar2 = local_6c, uVar3 = Kernel::Signature::typeCons((Signature *)0x2d2998),
                uVar2 < uVar3) {
            bVar1 = Kernel::Signature::isInterpretedNonDefault(DAT_01333830,local_6c);
            if (!bVar1) {
              Lib::DArray<Lib::DArray<int>_>::operator[]
                        ((DArray<Lib::DArray<int>_> *)(in_RDI + 5),(ulong)local_6c);
              Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)local_6c);
              Lib::DArray<int>::ensure
                        ((DArray<int> *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         (size_t)in_stack_ffffffffffffff50);
              local_70 = 0;
              while (uVar2 = local_70,
                    puVar4 = Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)local_6c),
                    uVar2 <= *puVar4) {
                this_00 = Lib::DArray<Lib::DArray<int>_>::operator[]
                                    ((DArray<Lib::DArray<int>_> *)(in_RDI + 5),(ulong)local_6c);
                piVar7 = Lib::DArray<int>::operator[](this_00,(ulong)local_70);
                *piVar7 = -1;
                local_70 = local_70 + 1;
              }
            }
            local_6c = local_6c + 1;
          }
          return;
        }
        uVar2 = Kernel::Signature::predicateArity
                          ((Signature *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           in_stack_ffffffffffffff2c);
        puVar4 = Lib::DArray<unsigned_int>::operator[](in_RDI + 2,(ulong)local_40);
        *puVar4 = local_c;
        Kernel::Signature::getPredicate
                  ((Signature *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff2c);
        Kernel::Signature::Symbol::predType
                  ((Symbol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        local_54 = 1;
        for (local_58 = 0; local_58 < uVar2; local_58 = local_58 + 1) {
          Kernel::OperatorType::arg(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
          pTVar5 = Kernel::TermList::term((TermList *)0x2d2834);
          uVar3 = Kernel::Term::functor(pTVar5);
          puVar4 = Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)uVar3);
          in_stack_ffffffffffffff5c = *puVar4;
          if ((int)in_stack_ffffffffffffff5c < 1) {
            in_stack_ffffffffffffff5c = 1;
          }
          local_54 = in_stack_ffffffffffffff5c * local_54;
        }
        if (-local_54 - 1U <= local_c) break;
        local_c = local_54 + local_c;
        local_40 = local_40 + 1;
      }
      uVar6 = __cxa_allocate_exception(0x28);
      Lib::InvalidOperationException::InvalidOperationException
                ((InvalidOperationException *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      __cxa_throw(uVar6,&Lib::InvalidOperationException::typeinfo,
                  Lib::InvalidOperationException::~InvalidOperationException);
    }
    uVar2 = Kernel::Signature::functionArity
                      ((Signature *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff2c);
    puVar4 = Lib::DArray<unsigned_int>::operator[](in_RDI + 1,(ulong)local_10);
    *puVar4 = local_c;
    Kernel::Signature::getFunction
              ((Signature *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c);
    Kernel::Signature::Symbol::fnType
              ((Symbol *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    local_24 = 1;
    for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
      Kernel::OperatorType::arg(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
      pTVar5 = Kernel::TermList::term((TermList *)0x2d264a);
      uVar3 = Kernel::Term::functor(pTVar5);
      puVar4 = Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)uVar3);
      local_24 = *puVar4 * local_24;
    }
    if (-local_24 - 1U <= local_c) break;
    local_c = local_24 + local_c;
    local_10 = local_10 + 1;
  }
  uVar6 = __cxa_allocate_exception(0x28);
  Lib::InvalidOperationException::InvalidOperationException
            ((InvalidOperationException *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  __cxa_throw(uVar6,&Lib::InvalidOperationException::typeinfo,
              Lib::InvalidOperationException::~InvalidOperationException);
}

Assistant:

void FiniteModelMultiSorted::initTables()
{
  _f_offsets.ensure(env.signature->functions());
  _p_offsets.ensure(env.signature->predicates());

  // generate offsets per function for indexing f_interpreation
  // see addFunctionDefinition for how the offset is used to compute
  // the actual index
  unsigned offsets=0;
  for(unsigned f=0; f<env.signature->functions();f++){
    unsigned arity=env.signature->functionArity(f);
    _f_offsets[f]=offsets;

    OperatorType* sig = env.signature->getFunction(f)->fnType();
    unsigned add = 1;
    for(unsigned i=0;i<arity;i++) {
      add *= _sizes[sig->arg(i).term()->functor()];
    }

    if (UINT_MAX - add <= offsets) {
      // the SAT solver skipped some functions as they are eliminated
      // (the model, on the other hand, should be prepared to hold their values later too)
      INVALID_OPERATION("Model too large to represent!");
    }

    offsets += add;
  }
  _f_interpretation.expand(offsets,0);
  // can restart for predicates as indexing p_interepration instead
  offsets=0;
  for(unsigned p=1; p<env.signature->predicates();p++){
    unsigned arity=env.signature->predicateArity(p);
    _p_offsets[p]=offsets;

    OperatorType* sig = env.signature->getPredicate(p)->predType();
    unsigned add = 1;
    for(unsigned i=0;i<arity;i++) {
      int mult = _sizes[sig->arg(i).term()->functor()];
      ASS(mult>0);
      add *= (mult>0 ? mult : 1);
    }

    if (UINT_MAX - add <= offsets) {
      // the SAT solver skipped some functions as they are eliminated
      // (the model, on the other hand, should be prepared to hold their values later too)
      INVALID_OPERATION("Model too large to represent!");
    }

    offsets += add;
  }
  _p_interpretation.expand(offsets,0);

  sortRepr.ensure(env.signature->typeCons());
  for(unsigned s=0;s<env.signature->typeCons();s++){
    if(env.signature->isInterpretedNonDefault(s))
      continue;
    sortRepr[s].ensure(_sizes[s]+1);
    for(unsigned i=0;i<=_sizes[s];i++){
      sortRepr[s][i] = -1;
    }
  }
}